

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

void __thiscall Peeps::PeepFunc(Peeps *this)

{
  PeepsMD *this_00;
  IRKind IVar1;
  undefined2 uVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  IRKind IVar7;
  byte bVar8;
  OpCode OVar9;
  uint uVar10;
  uint uVar11;
  undefined4 *puVar12;
  LabelInstr *pLVar13;
  Func *pFVar14;
  BranchInstr *pBVar15;
  LabelInstr *instrNext;
  Instr *pIVar16;
  RegOpnd *pRVar17;
  IntConstOpnd *pIVar18;
  Instr *instr;
  Func *pFVar19;
  Peeps *this_01;
  Opnd *pOVar20;
  Func *instr_00;
  bool local_33;
  bool local_32;
  char local_31;
  bool peeped;
  bool peeped_1;
  
  uVar10 = Func::GetSourceContextId(this->func);
  uVar11 = Func::GetLocalFunctionId(this->func);
  local_31 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,PeepsPhase,uVar10,uVar11);
  AgenPeeps::PeepFunc(&this->peepsAgen);
  this_00 = &this->peepsMD;
  PeepsMD::Init(this_00,this);
  bVar6 = false;
  memset(this->regMap,0,0x108);
  SymTable::ClearStackSymScratch(this->func->m_symTable);
  pFVar14 = (Func *)this->func->m_headInstr;
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_005ac328:
  instr_00 = pFVar14;
  if (instr_00 == (Func *)0x0) {
    return;
  }
  pFVar19 = ((PeepsMD *)&instr_00->m_threadContextInfo)->func;
  pFVar14 = pFVar19;
  switch(*(IRKind *)((long)&instr_00->constructorCaches + 1)) {
  case InstrKindBranch:
    if ((local_31 == '\0') && (*(OpCode *)&instr_00->constructorCacheCount != Leave)) {
      pBVar15 = IR::Instr::AsBranchInstr((Instr *)instr_00);
      if ((pBVar15->m_branchTarget == (LabelInstr *)0x0) ||
         (uVar2 = (pBVar15->m_branchTarget->super_Instr).m_opcode, (ushort)(uVar2 - 0x299) < 0xfffe)
         ) {
        pFVar14 = (Func *)PeepBranch(pBVar15,(bool *)0x0);
        if ((pFVar14 == (Func *)0x0) ||
           (this_01 = (Peeps *)pFVar14->m_scriptContextInfo, this_01 == (Peeps *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x7c,"(instrNext && instrNext->m_prev)",
                             "instrNext && instrNext->m_prev");
          if (!bVar5) {
LAB_005ac905:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar12 = 0;
          this_01 = (Peeps *)pFVar14->m_scriptContextInfo;
        }
        if (*(IRKind *)((long)this_01->regMap + 0x19) == InstrKindBranch) {
          pBVar15 = IR::Instr::AsBranchInstr((Instr *)this_01);
          pFVar14 = (Func *)HoistSameInstructionAboveSplit(this,pBVar15,(Instr *)pFVar14);
        }
      }
    }
    goto LAB_005ac328;
  case InstrKindLabel:
  case InstrKindProfiledLabel:
    if (local_31 == '\0') {
      ClearRegMap(this);
      pLVar13 = IR::Instr::AsLabelInstr((Instr *)instr_00);
      if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
           (pLVar13->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar13->labelRefs) &&
         ((pLVar13->field_0x78 & 4) == 0)) {
        pLVar13 = IR::Instr::AsLabelInstr((Instr *)instr_00);
        pFVar19 = (Func *)PeepUnreachableLabel(pLVar13,bVar6,&local_33);
        pFVar14 = pFVar19;
        if (local_33 != false) goto LAB_005ac328;
      }
      else {
        pIVar16 = IR::Instr::GetPrevRealInstr((Instr *)instr_00);
        if (pIVar16->m_kind == InstrKindBranch) {
          pBVar15 = IR::Instr::AsBranchInstr(pIVar16);
          bVar5 = IR::BranchInstr::IsUnconditional(pBVar15);
          if (((bVar5) && (bVar5 = IR::BranchInstr::IsMultiBranch(pBVar15), !bVar5)) &&
             ((Func *)pBVar15->m_branchTarget == instr_00)) {
            pFVar3 = (Func *)(pBVar15->super_Instr).m_next;
            pFVar14 = (Func *)PeepBranch(pBVar15,&local_32);
            if ((local_32 != false) || (pFVar14 != pFVar3)) goto LAB_005ac328;
          }
        }
      }
      pLVar13 = IR::Instr::AsLabelInstr((Instr *)instr_00);
      bVar8 = pLVar13->field_0x78;
      IVar7 = *(IRKind *)((long)&pFVar19->constructorCaches + 1);
      if ((IVar7 == InstrKindProfiledLabel) || (IVar7 == InstrKindLabel)) {
        pLVar13 = IR::Instr::AsLabelInstr((Instr *)instr_00);
        instrNext = IR::Instr::AsLabelInstr((Instr *)pFVar19);
        pFVar19 = (Func *)CleanupLabel(pLVar13,instrNext);
        IVar7 = *(IRKind *)((long)&pFVar19->constructorCaches + 1);
      }
      pFVar14 = pFVar19;
      if ((IVar7 != InstrKindLabel) && (IVar7 != InstrKindProfiledLabel)) {
        IVar1 = *(IRKind *)((long)((Peeps *)pFVar19->m_scriptContextInfo)->regMap + 0x19);
        if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar12 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                             ,0x61,
                             "(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr())",
                             "instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr()");
          if (!bVar6) goto LAB_005ac905;
          *puVar12 = 0;
          IVar7 = *(IRKind *)((long)&pFVar19->constructorCaches + 1);
        }
        if ((IVar7 != InstrKindLabel) && (IVar7 != InstrKindProfiledLabel)) {
          pFVar14 = (Func *)pFVar19->m_scriptContextInfo;
        }
      }
      bVar8 = bVar8 & 2;
      pLVar13 = IR::Instr::AsLabelInstr((Instr *)pFVar14);
      if (bVar8 == 0) {
        bVar5 = false;
      }
      else {
        bVar5 = (bool)((pLVar13->field_0x78 & 2) >> 1);
      }
      bVar6 = (bool)(bVar8 >> 1);
      pFVar14 = (Func *)PeepCondMove((Peeps *)pFVar14,pLVar13,(Instr *)pFVar19,bVar5);
    }
    goto LAB_005ac328;
  case InstrKindPragma:
    goto switchD_005ac350_caseD_8;
  }
  bVar5 = LowererMD::IsAssign((Instr *)instr_00);
  if (bVar5) {
    if (local_31 == '\0') {
      pFVar14 = (Func *)PeepAssign(this,(Instr *)instr_00);
    }
    goto LAB_005ac328;
  }
  OVar9 = *(OpCode *)&instr_00->constructorCacheCount;
  if ((OVar9 == StartCall) || (OVar9 == LoweredStartCall)) goto LAB_005ac491;
  if (OVar9 == MOVSD_ZERO) {
    PeepsMD::PeepAssign(this_00,(Instr *)instr_00);
    pOVar20 = (Opnd *)instr_00->pinnedTypeRefs;
  }
  else {
    if ((OVar9 != DEC) && (OVar9 != INC)) {
      if (OVar9 == ArgOut_A_InlineBuiltIn) goto LAB_005ac491;
      if (local_31 == '\0') {
        pIVar16 = PeepRedundant(this,(Instr *)instr_00);
        pOVar20 = pIVar16->m_dst;
        if ((pOVar20 != (Opnd *)0x0) && (bVar5 = IR::Opnd::IsRegOpnd(pOVar20), bVar5)) {
          pRVar17 = IR::Opnd::AsRegOpnd(pOVar20);
          ClearReg(this,pRVar17->m_reg);
        }
        PeepsMD::ProcessImplicitRegs(this_00,pIVar16);
        OVar9 = pIVar16->m_opcode;
        if (OVar9 == TEST) {
          bVar5 = IR::Opnd::IsIntConstOpnd(pIVar16->m_src2);
          if (((bVar5) &&
              (pIVar18 = IR::Opnd::AsIntConstOpnd(pIVar16->m_src2),
              ((pIVar18->super_EncodableOpnd<long>).m_value & 0xffffff00) == 0)) &&
             (bVar5 = IR::Opnd::IsRegOpnd(pIVar16->m_src1), bVar5)) {
            pRVar17 = IR::Opnd::AsRegOpnd(pIVar16->m_src1);
            bVar8 = LinearScan::GetRegAttribs(pRVar17->m_reg);
            if ((((bVar8 & 8) != 0) &&
                (*(IRKind *)((long)&pFVar19->constructorCaches + 1) == InstrKindBranch)) &&
               ((*(OpCode *)&pFVar19->constructorCacheCount == JNE ||
                (*(OpCode *)&pFVar19->constructorCacheCount == JEQ)))) {
              pIVar16->m_src1->m_type = TyInt8;
              pIVar16->m_src2->m_type = TyInt8;
            }
          }
          OVar9 = pIVar16->m_opcode;
        }
        if (OVar9 == CVTSI2SD) {
          pOVar20 = pIVar16->m_dst;
          instr = IR::Instr::New(XORPS,pOVar20,pOVar20,pOVar20,pIVar16->m_func);
          IR::Instr::InsertBefore(pIVar16,instr);
        }
      }
      goto LAB_005ac328;
    }
    if (local_31 != '\0') goto LAB_005ac328;
    bVar5 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
    if (!bVar5) {
      uVar10 = Func::GetSourceContextId(this->func);
      uVar11 = Func::GetLocalFunctionId(this->func);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,AtomPhase,uVar10,uVar11);
      if (bVar5) goto LAB_005ac7c9;
      goto LAB_005ac8b6;
    }
LAB_005ac7c9:
    if (*(IRKind *)((long)&instr_00->constructorCaches + 1) == InstrKindEntry) {
LAB_005ac7d0:
      pIVar16 = IR::Instr::GetNextRealInstr((Instr *)instr_00);
      bVar5 = IsJccOrShiftInstr(pIVar16);
      if (bVar5) goto LAB_005ac837;
      if (pIVar16->m_kind != InstrKindExit) {
        pIVar16 = IR::Instr::GetNextRealInstr(pIVar16);
        bVar5 = IsJccOrShiftInstr(pIVar16);
        if (bVar5) goto LAB_005ac837;
      }
    }
    else {
      pIVar16 = IR::Instr::GetPrevRealInstr((Instr *)instr_00);
      bVar5 = IsJccOrShiftInstr(pIVar16);
      if (!bVar5) {
        if (pIVar16->m_kind != InstrKindEntry) {
          pIVar16 = IR::Instr::GetPrevRealInstr(pIVar16);
          bVar5 = IsJccOrShiftInstr(pIVar16);
          if (bVar5) goto LAB_005ac837;
        }
        if (*(IRKind *)((long)&instr_00->constructorCaches + 1) == InstrKindExit) goto LAB_005ac8b6;
        goto LAB_005ac7d0;
      }
LAB_005ac837:
      pIVar18 = IR::IntConstOpnd::New
                          (1,((Opnd *)instr_00->pinnedTypeRefs)->m_type,(Func *)instr_00->m_workItem
                           ,false);
      pFVar19 = (Func *)IR::Instr::New(ADD,(Opnd *)instr_00->pinnedTypeRefs,
                                       (Opnd *)instr_00->pinnedTypeRefs,&pIVar18->super_Opnd,
                                       (Func *)instr_00->m_workItem);
      if (*(OpCode *)&instr_00->constructorCacheCount == DEC) {
        *(OpCode *)&pFVar19->constructorCacheCount = SUB;
      }
      IR::Instr::InsertAfter((Instr *)instr_00,(Instr *)pFVar19);
      IR::Instr::Remove((Instr *)instr_00);
      instr_00 = pFVar19;
    }
LAB_005ac8b6:
    pOVar20 = (Opnd *)instr_00->pinnedTypeRefs;
  }
  if ((pOVar20 != (Opnd *)0x0) && (bVar5 = IR::Opnd::IsRegOpnd(pOVar20), bVar5)) {
    pRVar17 = IR::Opnd::AsRegOpnd(pOVar20);
    ClearReg(this,pRVar17->m_reg);
  }
  goto LAB_005ac328;
switchD_005ac350_caseD_8:
  if (*(OpCode *)&instr_00->constructorCacheCount == Nop) {
LAB_005ac491:
    IR::Instr::Remove((Instr *)instr_00);
  }
  goto LAB_005ac328;
}

Assistant:

void
Peeps::PeepFunc()
{
    bool peepsEnabled = true;
    if (PHASE_OFF(Js::PeepsPhase, this->func))
    {
        peepsEnabled = false;
    }

#if defined(_M_IX86) || defined(_M_X64)
    // Agen dependency elimination pass
    // Since it can reveal load elimination opportunities for the normal peeps pass, we do it separately.
    this->peepsAgen.PeepFunc();
#endif

    this->peepsMD.Init(this);

    // Init regMap
    memset(this->regMap, 0, sizeof(this->regMap));

    // Scratch field needs to be cleared.
    this->func->m_symTable->ClearStackSymScratch();

    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            if (!peepsEnabled)
            {
                break;
            }
            // Don't carry any regMap info across label
            this->ClearRegMap();

            // Remove unreferenced labels
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                bool peeped;
                instrNext = PeepUnreachableLabel(instr->AsLabelInstr(), isInHelper, &peeped);
                if(peeped)
                {
                    continue;
                }
            }
            else
            {
                // Try to peep a previous branch again after dead label blocks are removed. For instance:
                //         jmp L2
                //     L3:
                //         // dead code
                //     L2:
                // L3 is unreferenced, so after that block is removed, the branch-to-next can be removed. After that, if L2 is
                // unreferenced and only has fallthrough, it can be removed as well.
                IR::Instr *const prevInstr = instr->GetPrevRealInstr();
                if(prevInstr->IsBranchInstr())
                {
                    IR::BranchInstr *const branch = prevInstr->AsBranchInstr();
                    if(branch->IsUnconditional() && !branch->IsMultiBranch() && branch->GetTarget() == instr)
                    {
                        bool peeped;
                        IR::Instr *const branchNext = branch->m_next;
                        IR::Instr *const branchNextAfterPeep = PeepBranch(branch, &peeped);
                        if(peeped || branchNextAfterPeep != branchNext)
                        {
                            // The peep did something, restart from after the branch
                            instrNext = branchNextAfterPeep;
                            continue;
                        }
                    }
                }
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;

            if (instrNext->IsLabelInstr())
            {
                // CLean up double label
                instrNext = this->CleanupLabel(instr->AsLabelInstr(), instrNext->AsLabelInstr());
            }

#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr());
            IR::LabelInstr *const peepCondMoveLabel =
                instrNext->IsLabelInstr() ? instrNext->AsLabelInstr() : instrNext->m_prev->AsLabelInstr();
            instrNext = PeepCondMove(peepCondMoveLabel, instrNext, isInHelper && peepCondMoveLabel->isOpHelper);
#endif

            break;
        }

        case IR::InstrKindBranch:
        {
            if (!peepsEnabled || instr->m_opcode == Js::OpCode::Leave)
            {
                break;
            }

            IR::BranchInstr *branchInstr = instr->AsBranchInstr();
            IR::LabelInstr* target = branchInstr->GetTarget();

            // Don't remove any branches to the generator's epilogue
            if (target != nullptr && target->IsGeneratorEpilogueLabel())
            {
                break;
            }

            instrNext = Peeps::PeepBranch(branchInstr);
#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext && instrNext->m_prev);
            if (instrNext->m_prev->IsBranchInstr())
            {
                instrNext = this->HoistSameInstructionAboveSplit(instrNext->m_prev->AsBranchInstr(), instrNext);
            }

#endif
            break;
        }
        case IR::InstrKindPragma:
            if (instr->m_opcode == Js::OpCode::Nop)
            {
                instr->Remove();
            }
            break;

        default:
            if (LowererMD::IsAssign(instr))
            {
                if (!peepsEnabled)
                {
                    break;
                }
                // Cleanup spill code
                instrNext = this->PeepAssign(instr);
            }
            else if (instr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                || instr->m_opcode == Js::OpCode::StartCall
                || instr->m_opcode == Js::OpCode::LoweredStartCall)
            {
                // ArgOut/StartCall are normally lowered by the lowering of the associated call instr.
                // If the call becomes unreachable, we could end up with an orphan ArgOut or StartCall.
                // Just delete these StartCalls
                instr->Remove();
            }
#if defined(_M_IX86) || defined(_M_X64)
            else if (instr->m_opcode == Js::OpCode::MOVSD_ZERO)
            {
                this->peepsMD.PeepAssign(instr);
                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }
            else if ( (instr->m_opcode == Js::OpCode::INC ) || (instr->m_opcode == Js::OpCode::DEC) )
            {
                // Check for any of the following patterns which can cause partial flag dependency
                //
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                // INC or DEC                                             INC or DEC
                // -------------------------------------------------- OR -----------------------
                // INC or DEC                                             INC or DEC
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                //
                // With this optimization if any of the above pattern found, substitute INC/DEC with ADD/SUB respectively.
                if (!peepsEnabled)
                {
                    break;
                }

                if (AutoSystemInfo::Data.IsAtomPlatform() || PHASE_FORCE(Js::AtomPhase, this->func))
                {
                    bool pattern_found=false;

                    if ( !(instr->IsEntryInstr()) )
                    {
                        IR::Instr *prevInstr = instr->GetPrevRealInstr();
                        if ( IsJccOrShiftInstr(prevInstr)  )
                        {
                            pattern_found = true;
                        }
                        else if ( !(prevInstr->IsEntryInstr()) && IsJccOrShiftInstr(prevInstr->GetPrevRealInstr()) )
                        {
                            pattern_found=true;
                        }
                    }

                    if ( !pattern_found && !(instr->IsExitInstr()) )
                    {
                        IR::Instr *nextInstr = instr->GetNextRealInstr();
                        if ( IsJccOrShiftInstr(nextInstr) )
                        {
                            pattern_found = true;
                        }
                        else if ( !(nextInstr->IsExitInstr() ) && (IsJccOrShiftInstr(nextInstr->GetNextRealInstr())) )
                        {
                            pattern_found = true;
                        }
                    }

                    if (pattern_found)
                    {
                        IR::IntConstOpnd* constOne  = IR::IntConstOpnd::New((IntConstType) 1, instr->GetDst()->GetType(), instr->m_func);
                        IR::Instr * addOrSubInstr = IR::Instr::New(Js::OpCode::ADD, instr->GetDst(), instr->GetDst(), constOne, instr->m_func);

                        if (instr->m_opcode == Js::OpCode::DEC)
                        {
                            addOrSubInstr->m_opcode = Js::OpCode::SUB;
                        }

                        instr->InsertAfter(addOrSubInstr);
                        instr->Remove();
                        instr = addOrSubInstr;
                    }
                }

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }

#endif
            else
            {
                if (!peepsEnabled)
                {
                    break;
                }
#if defined(_M_IX86) || defined(_M_X64)
               instr = this->PeepRedundant(instr);
#endif

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
                // Kill callee-saved regs across calls and other implicit regs
                this->peepsMD.ProcessImplicitRegs(instr);

#if defined(_M_IX86) || defined(_M_X64)
                if (instr->m_opcode == Js::OpCode::TEST && instr->GetSrc2()->IsIntConstOpnd()
                    && ((instr->GetSrc2()->AsIntConstOpnd()->GetValue() & 0xFFFFFF00) == 0)
                    && instr->GetSrc1()->IsRegOpnd() && (LinearScan::GetRegAttribs(instr->GetSrc1()->AsRegOpnd()->GetReg()) & RA_BYTEABLE))
                {
                    // Only support if the branch is JEQ or JNE to ensure we don't look at the sign flag
                    if (instrNext->IsBranchInstr() &&
                        (instrNext->m_opcode == Js::OpCode::JNE || instrNext->m_opcode == Js::OpCode::JEQ))
                    {
                        instr->GetSrc1()->SetType(TyInt8);
                        instr->GetSrc2()->SetType(TyInt8);
                    }
                }

                if (instr->m_opcode == Js::OpCode::CVTSI2SD)
                {
                    IR::Instr *xorps = IR::Instr::New(Js::OpCode::XORPS, instr->GetDst(), instr->GetDst(), instr->GetDst(), instr->m_func);
                    instr->InsertBefore(xorps);
                }
#endif
            }
        }
    }